

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_protect.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2d5e26::mock_region_factory::add
          (mock_region_factory *this,
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          regions,uint64_t original_size,uint64_t new_size)

{
  in_memory *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  uint64_t minimum_size;
  ulong __length;
  ulong uVar1;
  char *__file;
  region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper> builder;
  shared_ptr<pstore::file::in_memory> local_60;
  region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper> local_50;
  
  this_00 = (this->file_).super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  this_01 = (this->file_).super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  if (new_size < original_size) {
    pstore::assert_failed
              ("new_size >= original_size",
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
               ,0x111);
  }
  minimum_size = (this->super_factory).min_size_;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_60.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  local_60.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = this_01;
  pstore::region::region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper>::
  region_builder(&local_50,&local_60,(this->super_factory).full_size_,minimum_size);
  if (local_60.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  uVar1 = (new_size + minimum_size) - 1;
  __length = uVar1 % minimum_size;
  __file = (char *)(uVar1 - __length);
  pstore::file::in_memory::truncate(this_00,__file,__length);
  pstore::region::region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper>::
  append(&local_50,regions,original_size,(long)__file - original_size);
  if (local_50.file_.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.file_.
               super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    return;
  }
  return;
}

Assistant:

void add (pstore::gsl::not_null<std::vector<pstore::region::memory_mapper_ptr> *> regions,
                  std::uint64_t original_size, std::uint64_t new_size) override {
            this->append<pstore::file::in_memory, mock_mapper> (file_, regions, original_size,
                                                                new_size);
        }